

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcParser::add_anon_obj(CTcParser *this,CTcSymObj *sym)

{
  undefined1 *puVar1;
  CVmHashEntry **ppCVar2;
  
  ppCVar2 = &(this->anon_obj_tail_->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.
             super_CVmHashEntryCS.super_CVmHashEntry.nxt_;
  if (this->anon_obj_tail_ == (CTcSymObj *)0x0) {
    ppCVar2 = (CVmHashEntry **)&this->anon_obj_head_;
  }
  *ppCVar2 = (CVmHashEntry *)sym;
  this->anon_obj_tail_ = sym;
  (sym->super_CTcSymObjBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
  super_CVmHashEntry.nxt_ = (CVmHashEntry *)0x0;
  puVar1 = &(sym->super_CTcSymObjBase).field_0xb9;
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

void CTcParser::add_anon_obj(CTcSymObj *sym)
{
    /* link it into our list */
    if (anon_obj_tail_ != 0)
        anon_obj_tail_->nxt_ = sym;
    else
        anon_obj_head_ = sym;
    anon_obj_tail_ = sym;

    /* it's the last one */
    sym->nxt_ = 0;

    /* mark the symbol as anonymous */
    sym->set_anon(TRUE);
}